

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::MILSpec::Value_ImmediateValue::set_allocated_tuple
          (Value_ImmediateValue *this,TupleValue *tuple)

{
  Arena *message_arena_00;
  Arena *submessage_arena_00;
  Arena *submessage_arena;
  Arena *message_arena;
  TupleValue *tuple_local;
  Value_ImmediateValue *this_local;
  
  message_arena_00 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
  clear_value(this);
  if (tuple != (TupleValue *)0x0) {
    submessage_arena_00 =
         google::protobuf::Arena::InternalHelper<CoreML::Specification::MILSpec::TupleValue>::
         GetOwningArena(tuple);
    message_arena = (Arena *)tuple;
    if (message_arena_00 != submessage_arena_00) {
      message_arena =
           (Arena *)google::protobuf::internal::
                    GetOwnedMessage<CoreML::Specification::MILSpec::TupleValue>
                              (message_arena_00,tuple,submessage_arena_00);
    }
    set_has_tuple(this);
    (this->value_).tensor_ = (TensorValue *)message_arena;
  }
  return;
}

Assistant:

void Value_ImmediateValue::set_allocated_tuple(::CoreML::Specification::MILSpec::TupleValue* tuple) {
  ::PROTOBUF_NAMESPACE_ID::Arena* message_arena = GetArenaForAllocation();
  clear_value();
  if (tuple) {
    ::PROTOBUF_NAMESPACE_ID::Arena* submessage_arena =
      ::PROTOBUF_NAMESPACE_ID::Arena::InternalHelper<::CoreML::Specification::MILSpec::TupleValue>::GetOwningArena(tuple);
    if (message_arena != submessage_arena) {
      tuple = ::PROTOBUF_NAMESPACE_ID::internal::GetOwnedMessage(
          message_arena, tuple, submessage_arena);
    }
    set_has_tuple();
    value_.tuple_ = tuple;
  }
  // @@protoc_insertion_point(field_set_allocated:CoreML.Specification.MILSpec.Value.ImmediateValue.tuple)
}